

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::AutoCloseFd> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::AutoCloseFd>,_kj::Maybe<kj::AutoCloseFd>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1834:30),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::AutoCloseFd> *result)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  char (*in_RCX) [41];
  char *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar4;
  int *piVar5;
  Promise<kj::AutoCloseFd> PVar6;
  AutoCloseFd local_1a0;
  String local_198;
  undefined8 local_180;
  undefined8 uStack_178;
  Exception local_170;
  
  piVar5 = (int *)0x0;
  if (*in_RDX != '\0') {
    piVar5 = (int *)(in_RDX + 4);
  }
  if (*in_RDX == '\x01') {
    local_1a0.fd = *piVar5;
    UnwindDetector::UnwindDetector(&local_1a0.unwindDetector);
    *piVar5 = -1;
    heap<kj::_::ImmediatePromiseNode<kj::AutoCloseFd>,kj::AutoCloseFd>((kj *)&local_170,&local_1a0);
    sVar2 = local_170.ownFile.content.size_;
    local_170.ownFile.content.size_ = 0;
    *(char **)this = local_170.ownFile.content.ptr;
    *(size_t *)(this + 8) = sVar2;
    AutoCloseFd::~AutoCloseFd(&local_1a0);
    pPVar4 = extraout_RDX;
  }
  else {
    Debug::makeDescription<char_const(&)[41]>
              (&local_198,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_170,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x72e,&local_198);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_180,&local_170);
    uVar3 = uStack_178;
    uStack_178 = 0;
    *(undefined8 *)this = local_180;
    *(undefined8 *)(this + 8) = uVar3;
    Exception::~Exception(&local_170);
    sVar2 = local_198.content.size_;
    pcVar1 = local_198.content.ptr;
    pPVar4 = extraout_RDX_00;
    if (local_198.content.ptr != (char *)0x0) {
      local_198.content.ptr = (char *)0x0;
      local_198.content.size_ = 0;
      (**(local_198.content.disposer)->_vptr_ArrayDisposer)
                (local_198.content.disposer,pcVar1,1,sVar2,sVar2,0);
      pPVar4 = extraout_RDX_01;
    }
  }
  PVar6.super_PromiseBase.node.ptr = pPVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}